

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O0

void cb(Fl_Widget *param_1,void *v)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint local_3c;
  uint local_38;
  int h;
  int w;
  Fl_Color c;
  int s;
  Fl_Font f;
  Fl_Widget_Type *wt;
  Fl_Type *t;
  void *v_local;
  Fl_Widget *param_0_local;
  
  t = (Fl_Type *)v;
  v_local = param_1;
  undo_checkpoint();
  undo_suspend();
  iVar1 = (*t->_vptr_Fl_Type[3])();
  wt = (Fl_Widget_Type *)CONCAT44(extraout_var,iVar1);
  if (wt == (Fl_Widget_Type *)0x0) {
    undo_current = undo_current + -1;
    undo_last = undo_last + -1;
  }
  else {
    iVar1 = (*(wt->super_Fl_Type)._vptr_Fl_Type[0x17])();
    if ((iVar1 != 0) && (iVar1 = (*(wt->super_Fl_Type)._vptr_Fl_Type[0x21])(), iVar1 == 0)) {
      _s = wt;
      Fl_Widget::labelsize(wt->o,Fl_Widget_Type::default_size);
      w = Fl_Widget_Type::default_size;
      (*(_s->super_Fl_Type)._vptr_Fl_Type[0x2b])(_s,2,&c,&w,&h);
      local_38 = 0;
      local_3c = 0;
      (*(_s->super_Fl_Type)._vptr_Fl_Type[0x2d])(_s,&local_38,&local_3c);
      iVar1 = (*(_s->super_Fl_Type)._vptr_Fl_Type[5])();
      iVar1 = strcmp((char *)CONCAT44(extraout_var_00,iVar1),"Fl_Menu_Bar");
      if (iVar1 == 0) {
        (*_s->o->_vptr_Fl_Widget[4])(_s->o,0,0,(ulong)local_38,(ulong)local_3c);
      }
      else {
        Fl_Widget::size(_s->o,local_38,local_3c);
      }
    }
    select_only(&wt->super_Fl_Type);
    set_modflag(1);
    (*(wt->super_Fl_Type)._vptr_Fl_Type[0xb])();
  }
  undo_resume();
  return;
}

Assistant:

static void cb(Fl_Widget *, void *v) {
  undo_checkpoint();
  undo_suspend();
  Fl_Type *t = ((Fl_Type*)v)->make();
  if (t) {
    if (t->is_widget() && !t->is_window()) {
      Fl_Widget_Type *wt = (Fl_Widget_Type *)t;

      // Set font sizes...
      wt->o->labelsize(Fl_Widget_Type::default_size);

      Fl_Font f;
      int s = Fl_Widget_Type::default_size;
      Fl_Color c;

      wt->textstuff(2, f, s, c);

      // Resize and/or reposition new widget...
      int w = 0, h = 0;
      wt->ideal_size(w, h);

      if (!strcmp(wt->type_name(), "Fl_Menu_Bar")) {
        // Move and resize the menubar across the top of the window...
        wt->o->resize(0, 0, w, h);
      } else {
        // Just resize to the ideal size...
        wt->o->size(w, h);
      }
    }
    select_only(t);
    set_modflag(1);
    t->open();
  } else {
    undo_current --;
    undo_last --;
  }
  undo_resume();
}